

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O2

bool __thiscall
aeron::archive::ArchiveProxy::stopRecording
          (ArchiveProxy *this,string *channel,int32_t streamId,int64_t correlationId,
          int64_t controlSessionId)

{
  bool bVar1;
  StopRecordingRequest *this_00;
  int64_t val;
  int32_t val_2;
  int64_t val_1;
  StopRecordingRequest msg;
  StopRecordingRequest local_68;
  
  local_68.m_offset = 0;
  local_68.m_buffer = (char *)0x0;
  local_68.m_bufferLength = 0;
  this_00 = wrapAndApplyHeader<io::aeron::archive::codecs::StopRecordingRequest>(this,&local_68);
  *(int64_t *)(this_00->m_buffer + this_00->m_offset) = controlSessionId;
  *(int64_t *)(this_00->m_buffer + this_00->m_offset + 8) = correlationId;
  *(int32_t *)(this_00->m_buffer + this_00->m_offset + 0x10) = streamId;
  io::aeron::archive::codecs::StopRecordingRequest::putChannel(this_00,channel);
  bVar1 = offer(this,(int)local_68.m_position - (int)local_68.m_offset);
  return bVar1;
}

Assistant:

bool ArchiveProxy::stopRecording(const std::string& channel, std::int32_t streamId, std::int64_t correlationId,
                                 std::int64_t controlSessionId) {
    codecs::StopRecordingRequest msg;

    wrapAndApplyHeader(msg)
        .controlSessionId(controlSessionId)
        .correlationId(correlationId)
        .streamId(streamId)
        .putChannel(channel);

    return offer(msg.encodedLength());
}